

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O2

void Jf_ManFree(Jf_Man_t *p)

{
  int *piVar1;
  float *pfVar2;
  word *__ptr;
  word **__ptr_00;
  abctime aVar3;
  Jf_Par_t *pJVar4;
  abctime time;
  char *pStr;
  int i_1;
  Vec_Mem_t *pVVar5;
  int i;
  long lVar6;
  
  pJVar4 = p->pPars;
  if (pJVar4->fVerbose != 0) {
    if (p->pDsd != (Sdm_Man_t *)0x0) {
      Sdm_ManPrintDsdStats(p->pDsd,0);
      pJVar4 = p->pPars;
      if (pJVar4->fVerbose == 0) goto LAB_005e41a5;
    }
    pVVar5 = p->vTtMem;
    if (pVVar5 != (Vec_Mem_t *)0x0) {
      pStr = (char *)(ulong)(uint)pVVar5->nEntries;
      printf("Unique truth tables = %d. Memory = %.2f MB   ",
             ((double)pVVar5->nPageAlloc * 8.0 +
              (double)(pVVar5->iPage + 1) *
              (double)(1 << ((byte)pVVar5->LogPageSze & 0x1f)) * (double)pVVar5->nEntrySize * 8.0 +
             48.0) * 9.5367431640625e-07);
      aVar3 = Abc_Clock();
      Abc_PrintTime((int)aVar3 - (int)p->clkStart,pStr,time);
      pJVar4 = p->pPars;
    }
  }
LAB_005e41a5:
  if (((pJVar4->fVeryVerbose != 0) && (pJVar4->fCutMin != 0)) && (pJVar4->fFuncDsd != 0)) {
    Jf_ManProfileClasses(p);
    pJVar4 = p->pPars;
  }
  if (pJVar4->fCoarsen != 0) {
    Gia_ManCleanMark0(p->pGia);
  }
  piVar1 = p->pGia->pRefs;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    p->pGia->pRefs = (int *)0x0;
  }
  piVar1 = (p->vCuts).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vCuts).pArray = (int *)0x0;
  }
  piVar1 = (p->vArr).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vArr).pArray = (int *)0x0;
  }
  piVar1 = (p->vDep).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vDep).pArray = (int *)0x0;
  }
  pfVar2 = (p->vFlow).pArray;
  if (pfVar2 != (float *)0x0) {
    free(pfVar2);
    (p->vFlow).pArray = (float *)0x0;
  }
  pfVar2 = (p->vRefs).pArray;
  if (pfVar2 != (float *)0x0) {
    free(pfVar2);
    (p->vRefs).pArray = (float *)0x0;
  }
  if ((p->pPars->fCutMin != 0) && (p->pPars->fFuncDsd == 0)) {
    pVVar5 = p->vTtMem;
    if (pVVar5 == (Vec_Mem_t *)0x0) {
      pVVar5 = (Vec_Mem_t *)0x0;
    }
    else {
      Vec_IntFreeP(&pVVar5->vTable);
      Vec_IntFreeP(&pVVar5->vNexts);
      pVVar5 = p->vTtMem;
    }
    for (lVar6 = 0; lVar6 <= pVVar5->iPage; lVar6 = lVar6 + 1) {
      __ptr = pVVar5->ppPages[lVar6];
      if (__ptr != (word *)0x0) {
        free(__ptr);
        pVVar5->ppPages[lVar6] = (word *)0x0;
      }
    }
    free(pVVar5->ppPages);
    free(pVVar5);
  }
  Vec_IntFreeP(&p->vCnfs);
  for (lVar6 = 0; __ptr_00 = (p->pMem).pPages, lVar6 < (p->pMem).nPagesAlloc; lVar6 = lVar6 + 1) {
    if (__ptr_00[lVar6] != (word *)0x0) {
      free(__ptr_00[lVar6]);
      (p->pMem).pPages[lVar6] = (word *)0x0;
    }
  }
  if (__ptr_00 != (word **)0x0) {
    free(__ptr_00);
    (p->pMem).pPages = (word **)0x0;
  }
  Vec_IntFreeP(&p->vTemp);
  free(p);
  return;
}

Assistant:

void Jf_ManFree( Jf_Man_t * p )
{
    if ( p->pPars->fVerbose && p->pDsd )
        Sdm_ManPrintDsdStats( p->pDsd, 0 );
    if ( p->pPars->fVerbose && p->vTtMem )
    {
        printf( "Unique truth tables = %d. Memory = %.2f MB   ", Vec_MemEntryNum(p->vTtMem), Vec_MemMemory(p->vTtMem) / (1<<20) ); 
        Abc_PrintTime( 1, "Time", Abc_Clock() - p->clkStart );
    }
    if ( p->pPars->fVeryVerbose && p->pPars->fCutMin && p->pPars->fFuncDsd )
        Jf_ManProfileClasses( p );
    if ( p->pPars->fCoarsen )
        Gia_ManCleanMark0( p->pGia );
    ABC_FREE( p->pGia->pRefs );
    ABC_FREE( p->vCuts.pArray );
    ABC_FREE( p->vArr.pArray );
    ABC_FREE( p->vDep.pArray );
    ABC_FREE( p->vFlow.pArray );
    ABC_FREE( p->vRefs.pArray );
    if ( p->pPars->fCutMin && !p->pPars->fFuncDsd )
    {
        Vec_MemHashFree( p->vTtMem );
        Vec_MemFree( p->vTtMem );
    }
    Vec_IntFreeP( &p->vCnfs );
    Vec_SetFree_( &p->pMem );
    Vec_IntFreeP( &p->vTemp );
    ABC_FREE( p );
}